

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg * __thiscall
fmt::v6::
basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
::do_get(basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
         *this,int index)

{
  bool bVar1;
  int iVar2;
  type tVar3;
  value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *pvVar4;
  int in_EDX;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *in_RSI;
  basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *in_RDI;
  value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *val;
  int num_args;
  basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *pbVar5;
  
  pbVar5 = in_RDI;
  basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  ::basic_format_arg(in_RDI);
  bVar1 = is_packed(in_RSI);
  if (bVar1) {
    if (in_EDX < 0xd) {
      tVar3 = type(in_RSI,in_EDX);
      pbVar5->type_ = tVar3;
      if (pbVar5->type_ != none_type) {
        pvVar4 = (in_RSI->field_1).values_;
        (pbVar5->value_).field_0.long_long_value = pvVar4[in_EDX].field_0.long_long_value;
        (pbVar5->value_).field_0.string.size = pvVar4[in_EDX].field_0.string.size;
      }
    }
  }
  else {
    iVar2 = max_size(in_RSI);
    if (in_EDX < iVar2) {
      pvVar4 = (in_RSI->field_1).values_ + (long)in_EDX * 2;
      (pbVar5->value_).field_0.long_long_value = (pvVar4->field_0).long_long_value;
      (pbVar5->value_).field_0.string.size = (pvVar4->field_0).string.size;
      pbVar5->type_ = pvVar4[1].field_0.int_value;
    }
  }
  return in_RDI;
}

Assistant:

format_arg do_get(int index) const {
    format_arg arg;
    if (!is_packed()) {
      auto num_args = max_size();
      if (index < num_args) arg = args_[index];
      return arg;
    }
    if (index > internal::max_packed_args) return arg;
    arg.type_ = type(index);
    if (arg.type_ == internal::none_type) return arg;
    internal::value<Context>& val = arg.value_;
    val = values_[index];
    return arg;
  }